

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

StringRef __thiscall llvm::AArch64::getDefaultCPU(AArch64 *this,StringRef Arch)

{
  ArchKind AVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  StringRef SVar5;
  StringRef Arch_00;
  
  Arch_00.Length = Arch.Data;
  Arch_00.Data = (char *)this;
  AVar1 = parseArch(Arch_00);
  if (AVar1 == INVALID) {
    pcVar2 = (char *)0x0;
    sVar3 = 0;
  }
  else {
    sVar3 = 7;
    pcVar2 = "generic";
    for (lVar4 = 0x14; lVar4 != 0x2b4; lVar4 = lVar4 + 0x20) {
      if ((*(ArchKind *)((long)&PTR_anon_var_dwarf_187824_001843a8 + lVar4 + 4) == AVar1) &&
         (*(char *)((long)&(anonymous_namespace)::AArch64CPUNames + lVar4) == '\x01')) {
        pcVar2 = *(char **)(&UNK_0018439c + lVar4);
        sVar3 = *(size_t *)((long)&PTR_anon_var_dwarf_178f2a_001843a0 + lVar4 + 4);
        break;
      }
    }
  }
  SVar5.Length = sVar3;
  SVar5.Data = pcVar2;
  return SVar5;
}

Assistant:

StringRef llvm::AArch64::getDefaultCPU(StringRef Arch) {
  AArch64::ArchKind AK = parseArch(Arch);
  if (AK == ArchKind::INVALID)
    return StringRef();

  // Look for multiple AKs to find the default for pair AK+Name.
  for (const auto &CPU : AArch64CPUNames)
    if (CPU.ArchID == AK && CPU.Default)
      return CPU.getName();

  // If we can't find a default then target the architecture instead
  return "generic";
}